

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
::~List_column(List_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
               *this)

{
  _List_node_base *p_Var1;
  Column_support *pCVar2;
  _Node *__tmp;
  _List_node_base *p_Var3;
  
  p_Var3 = (this->column_).
           super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  pCVar2 = &this->column_;
  if (p_Var3 != (_List_node_base *)pCVar2) {
    do {
      operator_delete(p_Var3[1]._M_next,8);
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)pCVar2);
    p_Var3 = (pCVar2->
             super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
             )._M_impl._M_node.super__List_node_base._M_next;
  }
  while (p_Var3 != (_List_node_base *)pCVar2) {
    p_Var1 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var1;
  }
  return;
}

Assistant:

inline List_column<Master_matrix>::~List_column()
{
  for (auto* entry : column_) {
    if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::unlink(entry);
    entryPool_->destroy(entry);
  }
}